

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O0

void __thiscall FIX::SessionSettings::validate(SessionSettings *this,Dictionary *dictionary)

{
  undefined8 this_00;
  bool bVar1;
  ConfigError *pCVar2;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string connectionType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string beginString;
  Dictionary *dictionary_local;
  SessionSettings *this_local;
  
  beginString.field_2._8_8_ = dictionary;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"BeginString",&local_59);
  Dictionary::getString((string *)local_38,dictionary,&local_58,false);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"FIX.4.0");
  if (((((bVar1) &&
        (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_38,"FIX.4.1"), bVar1)) &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"FIX.4.2"), bVar1)) &&
      ((bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"FIX.4.3"), bVar1 &&
       (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"FIX.4.4"), bVar1)))) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,BeginString_FIXT11), bVar1)) {
    connectionType.field_2._M_local_buf[0xe] = '\x01';
    pCVar2 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"BeginString",
               (allocator<char> *)(connectionType.field_2._M_local_buf + 0xf));
    std::operator+(&local_90,&local_b0," must be FIX.4.0 to FIX.4.4 or FIXT.1.1");
    ConfigError::ConfigError(pCVar2,&local_90);
    connectionType.field_2._M_local_buf[0xe] = '\0';
    __cxa_throw(pCVar2,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  this_00 = beginString.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"ConnectionType",&local_f9)
  ;
  Dictionary::getString((string *)local_d8,(Dictionary *)this_00,&local_f8,false);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8,"initiator");
  if ((bVar1) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_d8,"acceptor"), bVar1)) {
    pCVar2 = (ConfigError *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"ConnectionType",&local_141);
    std::operator+(&local_120,&local_140," must be \'initiator\' or \'acceptor\'");
    ConfigError::ConfigError(pCVar2,&local_120);
    __cxa_throw(pCVar2,&ConfigError::typeinfo,ConfigError::~ConfigError);
  }
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

EXCEPT(ConfigError) {
  std::string beginString = dictionary.getString(BEGINSTRING);
  if (beginString != BeginString_FIX40 && beginString != BeginString_FIX41 && beginString != BeginString_FIX42
      && beginString != BeginString_FIX43 && beginString != BeginString_FIX44 && beginString != BeginString_FIXT11) {
    throw ConfigError(std::string(BEGINSTRING) + " must be FIX.4.0 to FIX.4.4 or FIXT.1.1");
  }

  std::string connectionType = dictionary.getString(CONNECTION_TYPE);
  if (connectionType != "initiator" && connectionType != "acceptor") {
    throw ConfigError(std::string(CONNECTION_TYPE) + " must be 'initiator' or 'acceptor'");
  }
}